

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O2

void jsoncons::encode_traits<__int128,char,void>::
     encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (undefined8 *param_1,basic_json_visitor<char> *param_2,undefined8 param_3,
               error_code *param_4)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> j;
  __int128 in_stack_ffffffffffffffc8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_28;
  
  json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,___int128,_void>
  ::to_json((json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,___int128,_void>
             *)&local_28,in_stack_ffffffffffffffc8,(allocator_type *)*param_1);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump(&local_28,param_2,param_4);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&local_28);
  return;
}

Assistant:

static void encode(std::true_type,
                           const T& val, 
                           basic_json_visitor<CharT>& encoder,
                           const Json& /*proto*/, 
                           std::error_code& ec)
        {
            auto j = json_type_traits<Json,T>::to_json(val);
            j.dump(encoder, ec);
        }